

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool find_str_in_buf(string *str,vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  const_iterator cVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __first1;
  
  __first1._M_current = (char *)in_RDI;
  cVar2 = std::vector<char,_std::allocator<char>_>::begin(in_RDI);
  std::vector<char,_std::allocator<char>_>::end(in_RDI);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::
  search<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (__first1,in_RSI,in_stack_ffffffffffffffe8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cVar2._M_current);
  cVar2 = std::vector<char,_std::allocator<char>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     cVar2._M_current,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     in_RDI);
  return bVar1;
}

Assistant:

bool find_str_in_buf(const std::string str, const std::vector<char> &buf) {
	return std::search(buf.begin(), buf.end(), str.begin(), str.end()) != buf.end();
}